

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Server_editNode(UA_Server *server,UA_Session *session,UA_NodeId *nodeId,
                  UA_EditNodeCallback callback,void *data)

{
  UA_Node *pUVar1;
  UA_Node *editNode;
  UA_Node *node;
  void *data_local;
  UA_EditNodeCallback callback_local;
  UA_NodeId *nodeId_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  pUVar1 = UA_NodeStore_get(server->nodestore,nodeId);
  if (pUVar1 == (UA_Node *)0x0) {
    server_local._4_4_ = 0x80340000;
  }
  else {
    server_local._4_4_ = (*callback)(server,session,pUVar1,data);
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Server_editNode(UA_Server *server, UA_Session *session,
                   const UA_NodeId *nodeId, UA_EditNodeCallback callback,
                   const void *data) {
#ifndef UA_ENABLE_MULTITHREADING
    const UA_Node *node = UA_NodeStore_get(server->nodestore, nodeId);
    if(!node)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;
    UA_Node *editNode = (UA_Node*)(uintptr_t)node; // dirty cast
    return callback(server, session, editNode, data);
#else
    UA_StatusCode retval;
    do {
        UA_Node *copy = UA_NodeStore_getCopy(server->nodestore, nodeId);
        if(!copy)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        retval = callback(server, session, copy, data);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_NodeStore_deleteNode(copy);
            return retval;
        }
        retval = UA_NodeStore_replace(server->nodestore, copy);
    } while(retval != UA_STATUSCODE_GOOD);
    return UA_STATUSCODE_GOOD;
#endif
}